

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitAnyTest_x_iutest_x_String_Test::Body(iu_UnitAnyTest_x_iutest_x_String_Test *this)

{
  any *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  any a;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::any::any(&a,"test");
  iutest::any_cast<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
             (iutest *)&a,value);
  iutest::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (&iutest_ar,(internal *)"\"test\"","::iutest::any_cast< ::std::string >(a)","test",
             (char (*) [5])&local_190,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x34,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  if (a.content != (placeholder *)0x0) {
    (*(a.content)->_vptr_placeholder[1])();
  }
  return;
}

Assistant:

IUTEST(UnitAnyTest, String)
{
    ::iutest::any a = "test";
    IUTEST_EXPECT_EQ("test", ::iutest::any_cast< ::std::string >(a));
}